

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdragdrop.cpp
# Opt level: O0

int main(void)

{
  ushort uVar1;
  undefined8 uVar2;
  Am_Wrapper *pAVar3;
  Am_Constraint *pAVar4;
  undefined8 uVar5;
  Am_Object *pAVar6;
  Am_Method_Wrapper *pAVar7;
  Am_Value_List *pAVar8;
  undefined8 uVar9;
  ulong uVar10;
  Am_Slot_Flags flags;
  Am_Object local_308 [8];
  Am_Object local_300 [8];
  Am_Object local_2f8 [8];
  Am_Value_List local_2f0 [16];
  Am_Object local_2e0 [8];
  Am_Object local_2d8 [8];
  Am_Object local_2d0 [8];
  Am_Object local_2c8 [8];
  Am_Object local_2c0 [8];
  Am_Object local_2b8 [8];
  Am_Object local_2b0 [8];
  Am_Object local_2a8 [8];
  Am_Object local_2a0 [8];
  Am_Value_List local_298 [16];
  Am_Value_List local_288 [8];
  Am_Value_List select_list;
  Am_Object local_278 [8];
  Am_Object local_270 [8];
  Am_Object local_268 [8];
  Am_Object local_260 [8];
  Am_Value_List local_258 [16];
  Am_Object local_248 [8];
  Am_Value_List local_240 [16];
  Am_Object local_230 [8];
  Am_Value_List local_228 [16];
  Am_Object local_218 [8];
  Am_Object local_210 [8];
  Am_Value local_208;
  Am_Object local_1f8 [8];
  Am_Object local_1f0 [8];
  Am_Object window2;
  Am_Object local_1e0 [8];
  Am_Object local_1d8 [8];
  Am_Object local_1d0 [8];
  Am_Object target;
  Am_Object local_1c0 [8];
  Am_Object local_1b8 [8];
  Am_Object local_1b0 [8];
  Am_Object scroll2;
  Am_Object local_1a0 [8];
  Am_Object select3;
  Am_Formula local_190 [16];
  Am_Formula local_180 [16];
  Am_Object local_170 [8];
  Am_Object local_168 [8];
  Am_Object local_160 [8];
  Am_Object local_158 [8];
  Am_Object local_150 [8];
  Am_Object local_148 [8];
  Am_Object group3;
  Am_Object local_138 [8];
  Am_Object local_130 [8];
  Am_Object local_128 [8];
  Am_Object scroll1;
  Am_Object local_118 [8];
  Am_Object select2;
  Am_Object local_108 [8];
  Am_Object group2;
  Am_Object local_f8 [8];
  Am_Object local_f0 [8];
  Am_Object local_e8 [8];
  Am_Value_List local_e0 [16];
  Am_Object local_d0 [8];
  Am_Value_List local_c8 [16];
  Am_Object local_b8 [8];
  Am_Value_List local_b0 [16];
  Am_Object local_a0 [8];
  Am_Object local_98 [8];
  Am_Object local_90 [8];
  Am_Object local_88 [8];
  Am_Object window1;
  Am_Object undo_handler;
  Am_Object local_70 [8];
  Am_Object select1;
  Am_Object local_60 [8];
  Am_Object local_58 [8];
  Am_Object local_50 [8];
  Am_Object local_48 [8];
  Am_Object local_40 [8];
  Am_Object local_38 [24];
  Am_Object local_20 [8];
  Am_Object local_18 [8];
  Am_Object group1;
  
  Am_Initialize();
  Am_Object::Create((char *)local_20);
  uVar1 = Am_Object::Set((ushort)local_20,0x66,300);
  uVar2 = Am_Object::Set(uVar1,0x67,400);
  Am_Object::Create((char *)local_40);
  uVar1 = Am_Object::Set((ushort)local_40,0x66,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,0x32);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)select_target);
  uVar5 = Am_Object::Set(uVar1,(Am_Constraint *)0x6b,(ulong)pAVar4);
  Am_Object::Create((char *)local_48);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,0x1a1,local_48,0);
  Am_Object::Am_Object(local_38,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_38,1,0);
  Am_Object::Create((char *)local_58);
  uVar1 = Am_Object::Set((ushort)local_58,100,100);
  uVar1 = Am_Object::Set(uVar1,0x66,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,0x32);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_50,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_50,1,0);
  Am_Object::Create((char *)&select1);
  uVar1 = Am_Object::Set((ushort)&select1,100,100);
  uVar1 = Am_Object::Set(uVar1,0x65,100);
  uVar1 = Am_Object::Set(uVar1,0x66,0x32);
  uVar1 = Am_Object::Set(uVar1,0x67,0x32);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Add(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_60,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_60,1,0);
  Am_Object::Am_Object(local_18,pAVar6);
  Am_Object::~Am_Object(local_60);
  Am_Object::~Am_Object(&select1);
  Am_Object::~Am_Object(local_50);
  Am_Object::~Am_Object(local_58);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(local_48);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(local_20);
  Am_Object::Create((char *)&undo_handler);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_18);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&undo_handler,(Am_Wrapper *)0x193,(ulong)pAVar3);
  Am_Object::Am_Object(local_70,pAVar6);
  Am_Object::~Am_Object(&undo_handler);
  Am_Object::Create((char *)&window1);
  Am_Object::Create((char *)local_90);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set((ushort)local_90,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&window1);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x174,(ulong)pAVar3);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                     ((Am_Object_Method *)&Am_Window_Destroy_And_Exit_Method);
  uVar1 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x89,(ulong)pAVar7);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
  uVar2 = Am_Object::Add(uVar1,(Am_Constraint *)0x94,(ulong)pAVar4);
  Am_Object::Create((char *)local_a0);
  Am_Value_List::Am_Value_List(local_b0);
  Am_Object::Create((char *)local_b8);
  uVar1 = Am_Object::Set((ushort)local_b8,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x10801b);
  Am_Value_List::Am_Value_List(local_c8);
  uVar5 = Am_Value_List::Add(local_c8,"Item1",1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar5,"Item2",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar5 = Am_Value_List::Add(local_b0,pAVar3,1);
  Am_Object::Create((char *)local_d0);
  uVar1 = Am_Object::Set((ushort)local_d0,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x108033);
  Am_Value_List::Am_Value_List(local_e0);
  uVar9 = Am_Value_List::Add(local_e0,"New",1);
  uVar9 = Am_Value_List::Add(uVar9,"Middle",1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar9,"Old",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar5,pAVar3,1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)local_a0,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(local_98,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_98,1,0);
  Am_Object::Create((char *)local_f0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set((ushort)local_f0,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar5 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  Am_Object::Am_Object(local_f8,local_18);
  uVar5 = Am_Object::Add_Part(uVar5,local_f8,1,0);
  Am_Object::Am_Object(&group2,local_70);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,&group2,1,0);
  Am_Object::Am_Object(local_e8,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_e8,1,0);
  Am_Object::Am_Object(local_88,pAVar6);
  Am_Object::~Am_Object(local_e8);
  Am_Object::~Am_Object(&group2);
  Am_Object::~Am_Object(local_f8);
  Am_Object::~Am_Object(local_f0);
  Am_Object::~Am_Object(local_98);
  Am_Value_List::~Am_Value_List(local_e0);
  Am_Object::~Am_Object(local_d0);
  Am_Value_List::~Am_Value_List(local_c8);
  Am_Object::~Am_Object(local_b8);
  Am_Value_List::~Am_Value_List(local_b0);
  Am_Object::~Am_Object(local_a0);
  Am_Object::~Am_Object(local_90);
  Am_Object::Create((char *)&select2);
  uVar1 = Am_Object::Set((ushort)&select2,0x66,1000);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,0x67,1000);
  Am_Object::Am_Object(local_108,pAVar6);
  Am_Object::~Am_Object(&select2);
  Am_Object::Create((char *)&scroll1);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_108);
  uVar1 = Am_Object::Set((ushort)&scroll1,(Am_Wrapper *)0x193,(ulong)pAVar3);
  pAVar7 = Am_Where_Method::operator_cast_to_Am_Method_Wrapper_((Am_Where_Method *)&Am_In_Target);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x1a2,(ulong)pAVar7);
  Am_Object::Am_Object(local_118,pAVar6);
  Am_Object::~Am_Object(&scroll1);
  Am_Object::Create((char *)local_130);
  uVar1 = Am_Object::Set((ushort)local_130,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x14);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Fill_To_Right);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Fill_To_Bottom);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  uVar1 = Am_Object::Set(uVar1,0x18e,1000);
  uVar1 = Am_Object::Set(uVar1,399,1000);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  uVar2 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_138,local_108);
  uVar2 = Am_Object::Add_Part(uVar2,local_138,1,0);
  Am_Object::Am_Object(&group3,local_118);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,&group3,1,0);
  Am_Object::Am_Object(local_128,pAVar6);
  Am_Object::~Am_Object(&group3);
  Am_Object::~Am_Object(local_138);
  Am_Object::~Am_Object(local_130);
  Am_Object::Create((char *)local_150);
  uVar1 = Am_Object::Set((ushort)local_150,0x66,1000);
  uVar2 = Am_Object::Set(uVar1,0x67,1000);
  Am_Object::Create((char *)local_160);
  uVar1 = Am_Object::Set((ushort)local_160,0x66,200);
  uVar1 = Am_Object::Set(uVar1,0x67,300);
  uVar1 = Am_Object::Set(uVar1,0xa0,0x14);
  uVar5 = Am_Object::Set(uVar1,0xa1,0x14);
  Am_Object::Create((char *)local_170);
  Am_From_Owner((ushort)local_180);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(local_180);
  uVar1 = Am_Object::Set((ushort)local_170,(Am_Constraint *)0x66,(ulong)pAVar4);
  Am_From_Owner((ushort)local_190);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(local_190);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  Am_Object::Am_Object(local_168,pAVar6);
  uVar5 = Am_Object::Add_Part(uVar5,local_168,1,0);
  Am_Object::Am_Object(&select3,local_128);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,&select3,1,0);
  Am_Object::Am_Object(local_158,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_158,1,0);
  Am_Object::Am_Object(local_148,pAVar6);
  Am_Object::~Am_Object(local_158);
  Am_Object::~Am_Object(&select3);
  Am_Object::~Am_Object(local_168);
  Am_Formula::~Am_Formula(local_190);
  Am_Formula::~Am_Formula(local_180);
  Am_Object::~Am_Object(local_170);
  Am_Object::~Am_Object(local_160);
  Am_Object::~Am_Object(local_150);
  Am_Object::Create((char *)&scroll2);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_148);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&scroll2,(Am_Wrapper *)0x193,(ulong)pAVar3);
  Am_Object::Am_Object(local_1a0,pAVar6);
  Am_Object::~Am_Object(&scroll2);
  Am_Object::Create((char *)local_1b8);
  uVar1 = Am_Object::Set((ushort)local_1b8,0x66,300);
  uVar1 = Am_Object::Set(uVar1,0x67,400);
  uVar1 = Am_Object::Set(uVar1,0x18e,1000);
  uVar1 = Am_Object::Set(uVar1,399,1000);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Gray);
  uVar2 = Am_Object::Set(uVar1,(Am_Wrapper *)0x190,(ulong)pAVar3);
  Am_Object::Am_Object(local_1c0,local_148);
  uVar2 = Am_Object::Add_Part(uVar2,local_1c0,1,0);
  Am_Object::Am_Object(&target,local_1a0);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,&target,1,0);
  Am_Object::Am_Object(local_1b0,pAVar6);
  Am_Object::~Am_Object(&target);
  Am_Object::~Am_Object(local_1c0);
  Am_Object::~Am_Object(local_1b8);
  Am_Object::Create((char *)local_1d8);
  uVar1 = Am_Object::Set((ushort)local_1d8,100,400);
  uVar1 = Am_Object::Set(uVar1,0x65,0x82);
  uVar1 = Am_Object::Set(uVar1,0x66,100);
  uVar1 = Am_Object::Set(uVar1,0x67,0x28);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar3);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)select_target);
  uVar2 = Am_Object::Set(uVar1,(Am_Constraint *)0x6b,(ulong)pAVar4);
  Am_Object::Create((char *)&window2);
  pAVar7 = Am_Drop_Target_Do_Method::operator_cast_to_Am_Method_Wrapper_(&drop_do);
  uVar1 = Am_Object::Set((ushort)&window2,(Am_Method_Wrapper *)0xca,(ulong)pAVar7);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&drop_undo);
  uVar1 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x146,(ulong)pAVar7);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&drop_undo);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x147,(ulong)pAVar7);
  Am_Object::Am_Object(local_1e0,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,0x1a1,local_1e0,0);
  Am_Object::Am_Object(local_1d0,pAVar6);
  Am_Object::~Am_Object(local_1e0);
  Am_Object::~Am_Object(&window2);
  Am_Object::~Am_Object(local_1d8);
  Am_Object::Create((char *)local_1f8);
  uVar1 = Am_Object::Set((ushort)local_1f8,100,0x136);
  uVar1 = Am_Object::Set(uVar1,0x66,600);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&window1);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x174,(ulong)pAVar3);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                     ((Am_Object_Method *)&Am_Window_Destroy_And_Exit_Method);
  uVar1 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x89,(ulong)pAVar7);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
  uVar1 = Am_Object::Add(uVar1,(Am_Constraint *)0x94,(ulong)pAVar4);
  Am_Alignment::operator_cast_to_Am_Value((Am_Alignment *)&local_208);
  uVar2 = Am_Object::Set(uVar1,(Am_Value *)0x97,(ulong)&local_208);
  Am_Object::Create((char *)local_218);
  Am_Value_List::Am_Value_List(local_228);
  Am_Object::Create((char *)local_230);
  uVar1 = Am_Object::Set((ushort)local_230,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x10801b);
  Am_Value_List::Am_Value_List(local_240);
  uVar5 = Am_Value_List::Add(local_240,"Item1",1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar5,"Item2",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar5 = Am_Value_List::Add(local_228,pAVar3,1);
  Am_Object::Create((char *)local_248);
  uVar1 = Am_Object::Set((ushort)local_248,true,1);
  uVar1 = Am_Object::Set(uVar1,(char *)0x150,0x108033);
  Am_Value_List::Am_Value_List(local_258);
  uVar9 = Am_Value_List::Add(local_258,"New",1);
  uVar9 = Am_Value_List::Add(uVar9,"Middle",1);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar9,"Old",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar5,pAVar3,1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)local_218,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(local_210,pAVar6);
  uVar2 = Am_Object::Add_Part(uVar2,local_210,1,0);
  Am_Object::Create((char *)local_268);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set((ushort)local_268,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar5 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar4);
  Am_Object::Am_Object(local_270,local_1b0);
  uVar5 = Am_Object::Add_Part(uVar5,local_270,1,0);
  Am_Object::Am_Object(local_278,local_1d0);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,local_278,1,0);
  Am_Object::Am_Object(local_260,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar2,local_260,1,0);
  Am_Object::Am_Object(local_1f0,pAVar6);
  Am_Object::~Am_Object(local_260);
  Am_Object::~Am_Object(local_278);
  Am_Object::~Am_Object(local_270);
  Am_Object::~Am_Object(local_268);
  Am_Object::~Am_Object(local_210);
  Am_Value_List::~Am_Value_List(local_258);
  Am_Object::~Am_Object(local_248);
  Am_Value_List::~Am_Value_List(local_240);
  Am_Object::~Am_Object(local_230);
  Am_Value_List::~Am_Value_List(local_228);
  Am_Object::~Am_Object(local_218);
  Am_Value::~Am_Value(&local_208);
  Am_Object::~Am_Object(local_1f8);
  Am_Value_List::Am_Value_List(local_298);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_70);
  uVar2 = Am_Value_List::Add(local_298,pAVar3,1);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_118);
  uVar2 = Am_Value_List::Add(uVar2,pAVar3,1);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_1a0);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar2,pAVar3,1);
  Am_Value_List::Am_Value_List(local_288,pAVar8);
  Am_Value_List::~Am_Value_List(local_298);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_288);
  Am_Object::Set((ushort)local_70,(Am_Wrapper *)0x1a0,(ulong)pAVar3);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_288);
  Am_Object::Set((ushort)local_118,(Am_Wrapper *)0x1a0,(ulong)pAVar3);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_288);
  Am_Object::Set((ushort)local_1a0,(Am_Wrapper *)0x1a0,(ulong)pAVar3);
  Am_Object::Am_Object(local_2a0,local_88);
  uVar2 = Am_Object::Add_Part(&Am_Screen,local_2a0,1,0);
  Am_Object::Am_Object(local_2a8,local_1f0);
  uVar2 = Am_Object::Add_Part(uVar2,local_2a8,1,0);
  Am_Object::Create((char *)local_2b8);
  uVar1 = Am_Object::Set((ushort)local_2b8,0x65,0x1cc);
  uVar1 = Am_Object::Set(uVar1,0x66,300);
  uVar1 = Am_Object::Set(uVar1,0x67,200);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&window1);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x174,(ulong)pAVar3);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                     ((Am_Object_Method *)&Am_Window_Destroy_And_Exit_Method);
  uVar5 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x89,(ulong)pAVar7);
  Am_Object::Copy((char *)local_2d0);
  uVar1 = Am_Object::Set((ushort)local_2d0,100,100);
  uVar10 = Am_Object::Set(uVar1,0x65,0x50);
  Am_Object::Get_Object((ushort)local_2c8,uVar10);
  pAVar7 = Am_Drop_Target_Interim_Do_Method::operator_cast_to_Am_Method_Wrapper_(&no_reds);
  flags = Am_Object::Add((ushort)local_2c8,(Am_Method_Wrapper *)0x1a2,(ulong)pAVar7);
  Am_Object::Get_Owner(local_2c0,flags);
  uVar5 = Am_Object::Add_Part(uVar5,local_2c0,1,0);
  Am_Object::Create((char *)local_2e0);
  uVar1 = Am_Object::Set((ushort)local_2e0,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  Am_Value_List::Am_Value_List(local_2f0);
  Am_Object::Create((char *)local_2f8);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_2f8);
  uVar9 = Am_Value_List::Add(local_2f0,pAVar3,1);
  Am_Object::Create((char *)local_300);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_300);
  uVar9 = Am_Value_List::Add(uVar9,pAVar3,1);
  Am_Object::Create((char *)local_308);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_308);
  pAVar8 = (Am_Value_List *)Am_Value_List::Add(uVar9,pAVar3,1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(local_2d8,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(uVar5,local_2d8,1,0);
  Am_Object::Am_Object(local_2b0,pAVar6);
  Am_Object::Add_Part(uVar2,local_2b0,1,0);
  Am_Object::~Am_Object(local_2b0);
  Am_Object::~Am_Object(local_2d8);
  Am_Object::~Am_Object(local_308);
  Am_Object::~Am_Object(local_300);
  Am_Object::~Am_Object(local_2f8);
  Am_Value_List::~Am_Value_List(local_2f0);
  Am_Object::~Am_Object(local_2e0);
  Am_Object::~Am_Object(local_2c0);
  Am_Object::~Am_Object(local_2c8);
  Am_Object::~Am_Object(local_2d0);
  Am_Object::~Am_Object(local_2b8);
  Am_Object::~Am_Object(local_2a8);
  Am_Object::~Am_Object(local_2a0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Value_List::~Am_Value_List(local_288);
  Am_Object::~Am_Object(local_1f0);
  Am_Object::~Am_Object(local_1d0);
  Am_Object::~Am_Object(local_1b0);
  Am_Object::~Am_Object(local_1a0);
  Am_Object::~Am_Object(local_148);
  Am_Object::~Am_Object(local_128);
  Am_Object::~Am_Object(local_118);
  Am_Object::~Am_Object(local_108);
  Am_Object::~Am_Object(local_88);
  Am_Object::~Am_Object(&window1);
  Am_Object::~Am_Object(local_70);
  Am_Object::~Am_Object(local_18);
  return 0;
}

Assistant:

int
main(void)
{
  Am_Initialize();

  Am_Object group1 =
      Am_Group.Create()
          .Set(Am_WIDTH, 300)
          .Set(Am_HEIGHT, 400)
          .Add_Part(
              Am_Rectangle.Create()
                  .Set(Am_WIDTH, 50)
                  .Set(Am_HEIGHT, 50)
                  .Set(Am_FILL_STYLE, Am_Red)
                  .Set(Am_LINE_STYLE, select_target)
                  .Add_Part(Am_DROP_TARGET, Am_Drop_Target_Command.Create()))
          .Add_Part(Am_Rectangle.Create()
                        .Set(Am_LEFT, 100)
                        .Set(Am_WIDTH, 50)
                        .Set(Am_HEIGHT, 50)
                        .Set(Am_FILL_STYLE, Am_Blue))
          .Add_Part(Am_Line.Create()
                        .Set(Am_LEFT, 100)
                        .Set(Am_TOP, 100)
                        .Set(Am_WIDTH, 50)
                        .Set(Am_HEIGHT, 50)
                        .Add(Am_FILL_STYLE, Am_Blue));

  Am_Object select1 = Am_Selection_Widget.Create().Set(Am_OPERATES_ON, group1);

  Am_Object undo_handler = Am_Multiple_Undo_Object.Create();

  Am_Object window1 =
      Am_Window.Create()
          .Set(Am_WIDTH, Am_Width_Of_Parts)
          .Set(Am_HEIGHT, Am_Height_Of_Parts)
          .Set(Am_UNDO_HANDLER, undo_handler)
          .Set(Am_DESTROY_WINDOW_METHOD, Am_Window_Destroy_And_Exit_Method)
          .Add(Am_LAYOUT, Am_Vertical_Layout)
          .Add_Part(Am_Menu_Bar.Create().Set(
              Am_ITEMS,
              Am_Value_List()
                  .Add(Am_Command.Create("Menu")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu1")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("Item1").Add("Item2")))
                  .Add(Am_Command.Create("menu2")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu2")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("New").Add("Middle").Add(
                                    "Old")))))
          .Add_Part(Am_Group.Create()
                        .Set(Am_WIDTH, Am_Width_Of_Parts)
                        .Set(Am_HEIGHT, Am_Height_Of_Parts)
                        .Add_Part(group1)
                        .Add_Part(select1));

  Am_Object group2 = Am_Group.Create().Set(Am_WIDTH, 1000).Set(Am_HEIGHT, 1000);

  Am_Object select2 = Am_Selection_Widget.Create()
                          .Set(Am_OPERATES_ON, group2)
                          .Set(Am_DROP_TARGET_TEST, Am_In_Target);

  Am_Object scroll1 = Am_Scrolling_Group.Create()
                          .Set(Am_LEFT, 20)
                          .Set(Am_TOP, 20)
                          .Set(Am_WIDTH, Am_Fill_To_Right)
                          .Set(Am_HEIGHT, Am_Fill_To_Bottom)
                          .Set(Am_INNER_WIDTH, 1000)
                          .Set(Am_INNER_HEIGHT, 1000)
                          .Set(Am_FILL_STYLE, Am_Motif_Gray)
                          .Add_Part(group2)
                          .Add_Part(select2);

  Am_Object group3 =
      Am_Group.Create()
          .Set(Am_WIDTH, 1000)
          .Set(Am_HEIGHT, 1000)
          .Add_Part(Am_Group.Create()
                        .Set(Am_WIDTH, 200)
                        .Set(Am_HEIGHT, 300)
                        .Set(Am_RIGHT_OFFSET, 20)
                        .Set(Am_BOTTOM_OFFSET, 20)
                        .Add_Part(Am_Rectangle.Create()
                                      .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                                      .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                                      .Set(Am_FILL_STYLE, Am_Motif_Gray))
                        .Add_Part(scroll1));

  Am_Object select3 = Am_Selection_Widget.Create().Set(Am_OPERATES_ON, group3);

  Am_Object scroll2 = Am_Scrolling_Group.Create()
                          .Set(Am_WIDTH, 300)
                          .Set(Am_HEIGHT, 400)
                          .Set(Am_INNER_WIDTH, 1000)
                          .Set(Am_INNER_HEIGHT, 1000)
                          .Set(Am_FILL_STYLE, Am_Motif_Gray)
                          .Set(Am_INNER_FILL_STYLE, Am_Motif_Light_Gray)
                          .Add_Part(group3)
                          .Add_Part(select3);

  Am_Object target =
      Am_Rectangle.Create()
          .Set(Am_LEFT, 400)
          .Set(Am_TOP, 130)
          .Set(Am_WIDTH, 100)
          .Set(Am_HEIGHT, 40)
          .Set(Am_FILL_STYLE, Am_White)
          .Set(Am_LINE_STYLE, select_target)
          .Add_Part(Am_DROP_TARGET, Am_Drop_Target_Command.Create()
                                        .Set(Am_DO_METHOD, drop_do)
                                        .Set(Am_UNDO_METHOD, drop_undo)
                                        .Set(Am_REDO_METHOD, drop_undo));

  Am_Object window2 =
      Am_Window.Create()
          .Set(Am_LEFT, 310)
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, Am_Height_Of_Parts)
          .Set(Am_UNDO_HANDLER, undo_handler)
          .Set(Am_DESTROY_WINDOW_METHOD, Am_Window_Destroy_And_Exit_Method)
          .Add(Am_LAYOUT, Am_Vertical_Layout)
          .Set(Am_H_ALIGN, Am_LEFT_ALIGN)
          .Add_Part(Am_Menu_Bar.Create().Set(
              Am_ITEMS,
              Am_Value_List()
                  .Add(Am_Command.Create("Menu")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu1")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("Item1").Add("Item2")))
                  .Add(Am_Command.Create("menu2")
                           .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
                           .Set(Am_LABEL, "Menu2")
                           .Set(Am_ITEMS,
                                Am_Value_List().Add("New").Add("Middle").Add(
                                    "Old")))))
          .Add_Part(Am_Group.Create()
                        .Set(Am_WIDTH, Am_Width_Of_Parts)
                        .Set(Am_HEIGHT, Am_Height_Of_Parts)
                        .Add_Part(scroll2)
                        .Add_Part(target));

  Am_Value_List select_list =
      Am_Value_List().Add(select1).Add(select2).Add(select3);

  select1.Set(Am_MULTI_SELECTIONS, select_list);

  select2.Set(Am_MULTI_SELECTIONS, select_list);

  select3.Set(Am_MULTI_SELECTIONS, select_list);

  Am_Screen.Add_Part(window1).Add_Part(window2).Add_Part(
      Am_Window.Create()
          .Set(Am_TOP, 460)
          .Set(Am_WIDTH, 300)
          .Set(Am_HEIGHT, 200)
          .Set(Am_UNDO_HANDLER, undo_handler)
          .Set(Am_DESTROY_WINDOW_METHOD, Am_Window_Destroy_And_Exit_Method)
          .Add_Part(target.Copy()
                        .Set(Am_LEFT, 100)
                        .Set(Am_TOP, 80)
                        .Get_Object(Am_DROP_TARGET)
                        .Add(Am_DROP_TARGET_TEST, no_reds)
                        .Get_Owner())
          .Add_Part(
              Am_Button_Panel.Create()
                  .Set(Am_LEFT, 20)
                  .Set(Am_TOP, 10)
                  .Set(Am_ITEMS, Am_Value_List()
                                     .Add(Am_Undo_Command.Create())
                                     .Add(Am_Redo_Command.Create())
                                     .Add(Am_Quit_No_Ask_Command.Create()))));

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}